

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O2

void ex_fact(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  int iVar1;
  t_float *ptVar2;
  t_float *ptVar3;
  t_float tVar4;
  long lVar5;
  double dVar6;
  
  lVar5 = argv->ex_type;
  if (lVar5 - 0xeU < 2) {
    if (optr->ex_type == 0xf) {
      ptVar3 = (optr->ex_cont).v_vec;
    }
    else {
      optr->ex_type = 0xf;
      ptVar3 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar3;
    }
    ptVar2 = (argv->ex_cont).v_vec;
    iVar1 = e->exp_vsize;
    for (lVar5 = 0; iVar1 != (int)lVar5; lVar5 = lVar5 + 1) {
      dVar6 = ex_dofact((int)ptVar2[lVar5]);
      ptVar3[lVar5] = (float)dVar6;
    }
  }
  else {
    if (lVar5 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar3 = (optr->ex_cont).v_vec;
        tVar4 = (t_float)(int)(argv->ex_cont).v_flt;
        goto LAB_001925c0;
      }
      optr->ex_type = 2;
      tVar4 = (t_float)(int)(argv->ex_cont).v_flt;
    }
    else {
      if (lVar5 != 1) {
        pd_error(e,"expr: FUNV_EVAL_UNARY(%d): bad left type %ld\n",0x3bf);
        return;
      }
      if (optr->ex_type == 0xf) {
        ptVar3 = (optr->ex_cont).v_vec;
        tVar4 = (argv->ex_cont).v_flt;
LAB_001925c0:
        dVar6 = ex_dofact((int)tVar4);
        ex_mkvector(ptVar3,(float)dVar6,e->exp_vsize);
        return;
      }
      optr->ex_type = 2;
      tVar4 = (argv->ex_cont).v_flt;
    }
    dVar6 = ex_dofact((int)tVar4);
    (optr->ex_cont).v_flt = (float)dVar6;
  }
  return;
}

Assistant:

static void
ex_fact(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;

        FUNC_EVAL_UNARY(left, ex_dofact,  (int), optr, 1);
}